

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_pushcclosure(lua_State *L,lua_CFunction fn,int n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  StkId pTVar3;
  undefined8 uVar4;
  CClosure *pCVar5;
  long lVar6;
  long lVar7;
  
  if (n == 0) {
    pTVar3 = L->top;
    (pTVar3->value_).f = fn;
    pTVar3->tt_ = 0x16;
    L->top = L->top + 1;
  }
  else {
    pCVar5 = luaF_newCclosure(L,n);
    pCVar5->f = fn;
    lVar6 = (long)n;
    lVar7 = lVar6 * 0x10;
    L->top = L->top + -lVar6;
    do {
      puVar1 = (undefined8 *)((long)&L->top[-1].value_ + lVar7);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)(pCVar5->upvalue + -1) + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar7 = lVar7 + -0x10;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    pTVar3 = L->top;
    (pTVar3->value_).gc = (GCObject *)pCVar5;
    pTVar3->tt_ = 0x66;
    L->top = L->top + 1;
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
      return;
    }
  }
  return;
}

Assistant:

LUA_API void lua_pushcclosure (lua_State *L, lua_CFunction fn, int n) {
  lua_lock(L);
  if (n == 0) {
    setfvalue(L->top, fn);
    api_incr_top(L);
  }
  else {
    CClosure *cl;
    api_checknelems(L, n);
    api_check(L, n <= MAXUPVAL, "upvalue index too large");
    cl = luaF_newCclosure(L, n);
    cl->f = fn;
    L->top -= n;
    while (n--) {
      setobj2n(L, &cl->upvalue[n], L->top + n);
      /* does not need barrier because closure is white */
    }
    setclCvalue(L, L->top, cl);
    api_incr_top(L);
    luaC_checkGC(L);
  }
  lua_unlock(L);
}